

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

size_t ALIGN_UP(size_t val,size_t alignment)

{
  ulong uVar1;
  size_t result;
  size_t alignment_local;
  size_t val_local;
  
  if ((alignment & alignment - 1) != 0) {
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/include/pal/utils.h"
            ,0x26,"0 == (alignment & (alignment - 1))","");
    fflush(_stderr);
    abort();
  }
  uVar1 = val + (alignment - 1) & (alignment - 1 ^ 0xffffffffffffffff);
  if (uVar1 < val) {
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/include/pal/utils.h"
            ,0x28,"result >= val","");
    fflush(_stderr);
    abort();
  }
  return uVar1;
}

Assistant:

inline size_t ALIGN_UP(size_t val, size_t alignment)
{
    // alignment must be a power of 2 for this implementation to work (need modulo otherwise)
    _ASSERTE(0 == (alignment & (alignment - 1)));
    size_t result = (val + (alignment - 1)) & ~(alignment - 1);
    _ASSERTE(result >= val);      // check for overflow
    return result;
}